

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

SPIRAccessChain * __thiscall
spirv_cross::Compiler::maybe_get<spirv_cross::SPIRAccessChain>(Compiler *this,uint32_t id)

{
  Types TVar1;
  size_t sVar2;
  Variant *this_00;
  uint32_t id_local;
  Compiler *this_local;
  
  sVar2 = VectorView<spirv_cross::Variant>::size
                    (&(this->ir).ids.super_VectorView<spirv_cross::Variant>);
  if (id < sVar2) {
    this_00 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)id);
    TVar1 = Variant::get_type(this_00);
    if (TVar1 == TypeAccessChain) {
      this_local = (Compiler *)get<spirv_cross::SPIRAccessChain>(this,id);
    }
    else {
      this_local = (Compiler *)0x0;
    }
  }
  else {
    this_local = (Compiler *)0x0;
  }
  return (SPIRAccessChain *)this_local;
}

Assistant:

T *maybe_get(uint32_t id)
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}